

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::AdvancedUsageManyCounters::Run(AdvancedUsageManyCounters *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  reference data_00;
  UVec4 *pUVar4;
  void *pvVar5;
  uint *puVar6;
  CallLogWrapper *pCVar7;
  int local_90;
  int local_8c;
  int i_1;
  int i;
  long error;
  UVec4 *data;
  undefined1 local_70 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> init_data;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  AdvancedUsageManyCounters *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout(std430) buffer Output {\n  mediump uvec4 data1[64];\n  mediump uvec4 data2[64];\n  mediump uvec4 data3[64];\n  mediump uvec4 data4[64];\n  mediump uvec4 data5[64];\n  mediump uvec4 data6[64];\n  mediump uvec4 data7[64];\n  mediump uvec4 data8[64];\n} g_out;\nuniform mediump int u_active_counters[8];\nlayout(binding = 0) uniform atomic_uint ac_counter[8];\nvoid main() {\n  mediump uint offset = 8u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data1[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[0]]));\n  g_out.data2[offset] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[1]]));\n  g_out.data3[offset] = uvec4(atomicCounter(ac_counter[u_active_counters[2]]));\n  g_out.data4[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[3]]));\n  g_out.data5[offset] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[4]]));\n  g_out.data6[offset] = uvec4(atomicCounter(ac_counter[u_active_counters[5]]));\n  g_out.data7[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[6]]));\n  g_out.data8[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[7]]));\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout(std430) buffer Output {\n  mediump uvec4 data1[64];\n  mediump uvec4 data2[64];\n  mediump uvec4 data3[64];\n  mediump uvec4 data4[64];\n  mediump uvec4 data5[64];\n  mediump uvec4 data6[64];\n  mediump uvec4 data7[64];\n  mediump uvec4 data8[64];\n} g_out;\nuniform mediump int u_active_counters[8];\nlayout(binding = 0) uniform atomic_uint ac_counter[8];\nvoid main() {\n  mediump uint offset = 8u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data1[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[0]]));\n  g_out.data2[offset] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[1]]));\n  g_out.data3[offset] = uvec4(atomicCounter(ac_counter[u_active_counters[2]]));\n  g_out.data4[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[3]]));\n  g_out.data5[offset] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[4]]));\n  g_out.data6[offset] = uvec4(atomicCounter(ac_counter[u_active_counters[5]]));\n  g_out.data7[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[6]]));\n  g_out.data8[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[7]]));\n}"
             ,&local_41);
  GVar2 = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,&local_40);
  this->prog_ = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->prog_);
  bVar1 = BasicUsageCS::CheckProgram(&this->super_BasicUsageCS,this->prog_,(bool *)0x0);
  if (bVar1) {
    data._4_4_ = 1000;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&data + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,0x400,
               (value_type_conflict4 *)((long)&data + 4),
               (allocator<unsigned_int> *)((long)&data + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&data + 3));
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    data_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,0x1000,data_00,0x88ea);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_ssbo);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_ssbo);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x2000,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->prog_);
    pCVar7 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar7,this->prog_,"u_active_counters[0]");
    glu::CallLogWrapper::glUniform1i(pCVar7,GVar3,0);
    pCVar7 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar7,this->prog_,"u_active_counters[1]");
    glu::CallLogWrapper::glUniform1i(pCVar7,GVar3,1);
    pCVar7 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar7,this->prog_,"u_active_counters[2]");
    glu::CallLogWrapper::glUniform1i(pCVar7,GVar3,2);
    pCVar7 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar7,this->prog_,"u_active_counters[3]");
    glu::CallLogWrapper::glUniform1i(pCVar7,GVar3,3);
    pCVar7 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar7,this->prog_,"u_active_counters[4]");
    glu::CallLogWrapper::glUniform1i(pCVar7,GVar3,4);
    pCVar7 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar7,this->prog_,"u_active_counters[5]");
    glu::CallLogWrapper::glUniform1i(pCVar7,GVar3,5);
    pCVar7 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar7,this->prog_,"u_active_counters[6]");
    glu::CallLogWrapper::glUniform1i(pCVar7,GVar3,6);
    pCVar7 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar7,this->prog_,"u_active_counters[7]");
    glu::CallLogWrapper::glUniform1i(pCVar7,GVar3,7);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,0,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_ssbo);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,8,8,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x3000);
    _i_1 = (AdvancedUsageManyCounters *)0x0;
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_ssbo);
    pUVar4 = (UVec4 *)glu::CallLogWrapper::glMapBufferRange
                                (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x400,1);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)this,0x40,pUVar4,1000);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0,
                       0x428);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_ssbo);
    pUVar4 = (UVec4 *)glu::CallLogWrapper::glMapBufferRange
                                (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0x90d2,0x400,0x400,1);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)this,0x40,pUVar4,0x3a8);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,4,
                       0x3a8);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_ssbo);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                         super_GLWrapper.super_CallLogWrapper,0x90d2,0x800,0x400,1);
    for (local_8c = 0; local_8c < 0x40; local_8c = local_8c + 1) {
      puVar6 = tcu::Vector<unsigned_int,_4>::x
                         ((Vector<unsigned_int,_4> *)((long)pvVar5 + (long)local_8c * 0x10));
      if (*puVar6 != 1000) {
        _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,8,
                       1000);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_ssbo);
    pUVar4 = (UVec4 *)glu::CallLogWrapper::glMapBufferRange
                                (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0x90d2,0xc00,0x400,1);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)this,0x40,pUVar4,1000);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0xc,
                       0x428);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_ssbo);
    pUVar4 = (UVec4 *)glu::CallLogWrapper::glMapBufferRange
                                (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0x90d2,0x1000,0x400,1);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)this,0x40,pUVar4,0x3a8);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0x10
                       ,0x3a8);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_ssbo);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                         super_GLWrapper.super_CallLogWrapper,0x90d2,0x1400,0x400,1);
    for (local_90 = 0; local_90 < 0x40; local_90 = local_90 + 1) {
      puVar6 = tcu::Vector<unsigned_int,_4>::x
                         ((Vector<unsigned_int,_4> *)((long)pvVar5 + (long)local_90 * 0x10));
      if (*puVar6 != 1000) {
        _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0x14
                       ,1000);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_ssbo);
    pUVar4 = (UVec4 *)glu::CallLogWrapper::glMapBufferRange
                                (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0x90d2,0x1800,0x400,1);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)this,0x40,pUVar4,1000);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0x18
                       ,0x428);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_ssbo);
    pUVar4 = (UVec4 *)glu::CallLogWrapper::glMapBufferRange
                                (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,0x90d2,0x1c00,0x400,1);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)this,0x40,pUVar4,1000);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      ((SACSubcaseBase *)this,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,0x1c
                       ,0x428);
    if (!bVar1) {
      _i_1 = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    this_local = _i_1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
  }
  else {
    this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* glsl_cs = NL
			"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;" NL "layout(std430) buffer Output {" NL
			"  mediump uvec4 data1[64];" NL "  mediump uvec4 data2[64];" NL "  mediump uvec4 data3[64];" NL
			"  mediump uvec4 data4[64];" NL "  mediump uvec4 data5[64];" NL "  mediump uvec4 data6[64];" NL
			"  mediump uvec4 data7[64];" NL "  mediump uvec4 data8[64];" NL "} g_out;" NL
			"uniform mediump int u_active_counters[8];" NL "layout(binding = 0) uniform atomic_uint ac_counter[8];" NL
			"void main() {" NL "  mediump uint offset = 8u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;" NL
			"  g_out.data1[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[0]]));" NL
			"  g_out.data2[offset] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[1]]));" NL
			"  g_out.data3[offset] = uvec4(atomicCounter(ac_counter[u_active_counters[2]]));" NL
			"  g_out.data4[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[3]]));" NL
			"  g_out.data5[offset] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[4]]));" NL
			"  g_out.data6[offset] = uvec4(atomicCounter(ac_counter[u_active_counters[5]]));" NL
			"  g_out.data7[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[6]]));" NL
			"  g_out.data8[offset] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[7]]));" NL "}";

		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;

		// create atomic counter buffer
		std::vector<GLuint> init_data(1024, 1000);
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 1024 * sizeof(GLuint), &init_data[0], GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glGenBuffers(1, &m_ssbo);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 8 * 64 * sizeof(UVec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		// set uniforms
		glUseProgram(prog_);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[0]"), 0);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[1]"), 1);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[2]"), 2);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[3]"), 3);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[4]"), 4);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[5]"), 5);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[6]"), 6);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[7]"), 7);

		// dispatch
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo);
		glDispatchCompute(8, 8, 1);

		// validate
		glMemoryBarrier(GL_ATOMIC_COUNTER_BARRIER_BIT | GL_SHADER_STORAGE_BARRIER_BIT);
		UVec4* data;
		long   error = NO_ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 0, 1064))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4), 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000 - 64))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 1 * sizeof(GLuint), 1000 - 64))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 2, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		for (int i = 0; i < 8 * 8; ++i)
			if (data[i].x() != 1000)
				error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 2 * sizeof(GLuint), 1000))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 3, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 3 * sizeof(GLuint), 1064))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 4, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000 - 64))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 4 * sizeof(GLuint), 1000 - 64))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 5, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		for (int i = 0; i < 8 * 8; ++i)
			if (data[i].x() != 1000)
				error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 5 * sizeof(GLuint), 1000))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 6, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 6 * sizeof(GLuint), 1064))
			error = ERROR;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
		data = static_cast<UVec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64 * sizeof(UVec4) * 7, 64 * sizeof(UVec4), GL_MAP_READ_BIT));
		if (!CheckCounterValues(8 * 8, data, 1000))
			error = ERROR;
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!CheckFinalCounterValue(counter_buffer_, 7 * sizeof(GLuint), 1064))
			error = ERROR;

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return error;
	}